

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

ostream * absl::lts_20240722::operator<<(ostream *out,Cord *cord)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dd;
  ChunkIterator __begin2;
  ChunkIterator local_a8;
  
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  local_a8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_a8.bytes_remaining_ = 0;
  local_a8.current_chunk_ = (string_view)ZEXT816(0);
  local_a8.btree_reader_.remaining_ = 0;
  local_a8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_0011041c;
    local_a8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_a8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    local_a8.current_chunk_._M_len = local_a8.bytes_remaining_;
  }
  else {
    local_a8.bytes_remaining_ = tree->length;
    if (local_a8.bytes_remaining_ == 0) goto LAB_00110421;
    Cord::ChunkIterator::InitTree(&local_a8,tree);
  }
  do {
    if (local_a8.bytes_remaining_ == 0) {
      return out;
    }
    while( true ) {
      std::ostream::write((char *)out,(long)local_a8.current_chunk_._M_str);
      if (local_a8.bytes_remaining_ == 0) break;
      sVar2 = local_a8.bytes_remaining_ - local_a8.current_chunk_._M_len;
      if (local_a8.bytes_remaining_ < local_a8.current_chunk_._M_len) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_a8.bytes_remaining_ = sVar2;
      if (sVar2 != 0) {
        if (((long)local_a8.btree_reader_.navigator_.height_ < 0) ||
           (local_a8.btree_reader_.navigator_.node_[local_a8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_a8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_a8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_a8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_a8.btree_reader_)
          ;
        }
      }
      if (local_a8.bytes_remaining_ == 0) {
        return out;
      }
    }
    operator<<();
LAB_0011041c:
    operator<<();
    uVar3 = extraout_XMM0_Da;
    uVar4 = extraout_XMM0_Db;
    uVar5 = extraout_XMM0_Dc;
    uVar6 = extraout_XMM0_Dd;
LAB_00110421:
    local_a8.current_chunk_._M_len._4_4_ = uVar4;
    local_a8.current_chunk_._M_len._0_4_ = uVar3;
    local_a8.current_chunk_._M_str._0_4_ = uVar5;
    local_a8.current_chunk_._M_str._4_4_ = uVar6;
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    out.write(chunk.data(), static_cast<std::streamsize>(chunk.size()));
  }
  return out;
}